

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QUrlQueryPrivate>::reset
          (QSharedDataPointer<QUrlQueryPrivate> *this,QUrlQueryPrivate *ptr)

{
  QUrlQueryPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != ptr) {
    if (ptr != (QUrlQueryPrivate *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar1 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar1 != (QUrlQueryPrivate *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&(pQVar1->itemList).d);
        operator_delete(pQVar1,0x28);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }